

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrORA0x0d(CPU *this)

{
  Memory *this_00;
  byte bVar1;
  uint16_t uVar2;
  byte bVar3;
  
  this_00 = this->m;
  uVar2 = this->PC;
  this->PC = uVar2 + 2;
  uVar2 = Memory::Read16(this_00,uVar2);
  bVar1 = Memory::Read8(this_00,uVar2);
  bVar1 = bVar1 | this->A;
  this->A = bVar1;
  if (bVar1 == 0) {
    bVar3 = this->field_0x2e | 0x40;
  }
  else {
    bVar3 = this->field_0x2e & 0xbf;
    if ((char)bVar1 < '\0') {
      bVar3 = bVar3 | 1;
      goto LAB_0010d2d6;
    }
  }
  bVar3 = bVar3 & 0xfe;
LAB_0010d2d6:
  this->field_0x2e = bVar3;
  return 4;
}

Assistant:

int CPU::instrORA0x0d() {
	ORA(absolute_addr());
	return 4;
}